

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O0

void handle_terminate(void)

{
  bool bVar1;
  long *plVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  exception *ex;
  exception_ptr local_18;
  exception_ptr local_10;
  exception_ptr p;
  
  printf("\nuncaught exception terminate handler called!\n");
  fflush(_stdout);
  std::current_exception();
  bVar1 = std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_10);
  if (bVar1) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_18,&local_10);
    auVar4 = std::rethrow_exception((exception_ptr)&local_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
    if (auVar4._8_4_ == 2) {
      plVar2 = (long *)__cxa_begin_catch(auVar4._0_8_);
      uVar3 = (**(code **)(*plVar2 + 0x10))();
      printf("%s\n",uVar3);
      fflush(_stdout);
      __cxa_end_catch();
    }
    else {
      __cxa_begin_catch(auVar4._0_8_);
      printf("caught an unknown exception in custom terminate handler.\n");
      __cxa_end_catch();
    }
  }
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_10);
  return;
}

Assistant:

void handle_terminate()
{
    printf( "\nuncaught exception terminate handler called!\n" );
    fflush(stdout);

    std::exception_ptr p = std::current_exception();

    if( p )
    {
        try
        {
            std::rethrow_exception( p );
        }
        catch(std::exception& ex)
        {
            printf("%s\n",ex.what());
            fflush(stdout);
        }
        catch(...)
        {
            printf("caught an unknown exception in custom terminate handler.\n");
        }
    }
}